

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDAGetLinWorkSpace(void *ida_mem,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  int iVar2;
  long liw;
  long lrw;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  sunindextype liw1;
  sunindextype lrw1;
  long local_58;
  long local_50;
  IDALsMem local_48;
  IDAMem local_40;
  long local_38;
  long local_30;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetLinWorkSpace",&local_40,&local_48);
  if (iVar1 == 0) {
    *lenrwLS = 3;
    *leniwLS = 0x21;
    if (local_40->ida_tempv1->ops->nvspace !=
        (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(local_40->ida_tempv1,&local_30,&local_38);
      *lenrwLS = *lenrwLS + local_30 * 3;
      *leniwLS = *leniwLS + local_38 * 3;
    }
    iVar1 = 0;
    if (local_48->LS->ops->space != (_func_SUNErrCode_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
      iVar2 = SUNLinSolSpace(local_48->LS,&local_50,&local_58);
      if (iVar2 == 0) {
        *lenrwLS = *lenrwLS + local_50;
        *leniwLS = *leniwLS + local_58;
      }
    }
  }
  return iVar1;
}

Assistant:

int IDAGetLinWorkSpace(void* ida_mem, long int* lenrwLS, long int* leniwLS)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 3;
  *leniwLS = 33;

  /* add N_Vector sizes */
  if (IDA_mem->ida_tempv1->ops->nvspace)
  {
    N_VSpace(IDA_mem->ida_tempv1, &lrw1, &liw1);
    *lenrwLS += 3 * lrw1;
    *leniwLS += 3 * liw1;
  }

  /* add LS sizes */
  if (idals_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(idals_mem->LS, &lrw, &liw);
    if (retval == 0)
    {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return (IDALS_SUCCESS);
}